

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void collect_hog_data(MACROBLOCK *x,BLOCK_SIZE bsize,BLOCK_SIZE sb_size,int plane,float *hog)

{
  uint rows_00;
  uint cols_00;
  int rows_01;
  int stride;
  long lVar1;
  int in_ECX;
  byte in_SIL;
  long in_RDI;
  uint8_t *in_R8;
  int b;
  int src_stride;
  uint8_t *src;
  int cols;
  int rows;
  int bw;
  int bh;
  int ss_y;
  int ss_x;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  float *hist;
  int cols_01;
  uint8_t *src8;
  uint local_58;
  uint local_54;
  int local_50;
  float *in_stack_ffffffffffffffb8;
  int iVar2;
  int iVar3;
  
  lVar1 = in_RDI + 0x1b0 + (long)in_ECX * 0xa30;
  iVar3 = *(int *)(lVar1 + 4);
  iVar2 = *(int *)(lVar1 + 8);
  rows_00 = (uint)block_size_high[in_SIL];
  cols_00 = (uint)block_size_wide[in_SIL];
  local_54 = rows_00;
  if (*(int *)(in_RDI + 0x20a0) < 0) {
    local_54 = (*(int *)(in_RDI + 0x20a0) >> 3) + rows_00;
  }
  rows_01 = (int)local_54 >> ((byte)iVar2 & 0x1f);
  local_58 = cols_00;
  if (*(int *)(in_RDI + 0x2098) < 0) {
    local_58 = (*(int *)(in_RDI + 0x2098) >> 3) + cols_00;
  }
  stride = (int)local_58 >> ((byte)iVar3 & 0x1f);
  if ((*(byte *)(in_RDI + 0x1f6c0 + (long)in_ECX) & 1) == 0) {
    hist = *(float **)(in_RDI + (long)in_ECX * 0x88 + 0x30);
    cols_01 = *(int *)(in_RDI + (long)in_ECX * 0x88 + 0x48);
    src8 = in_R8;
    is_cur_buf_hbd((MACROBLOCKD *)(in_RDI + 0x1a0));
    generate_hog(src8,stride,rows_01,cols_01,hist,0);
  }
  else {
    generate_hog_using_gradient_cache
              ((MACROBLOCK *)CONCAT44(iVar3,iVar2),rows_00,cols_00,
               (BLOCK_SIZE)((uint)rows_01 >> 0x18),(PLANE_TYPE)((uint)rows_01 >> 0x10),
               in_stack_ffffffffffffffb8);
  }
  for (local_50 = 0; local_50 < 0x20; local_50 = local_50 + 1) {
    *(float *)(in_R8 + (long)local_50 * 4) =
         (float)((iVar3 + 1) * (iVar2 + 1)) * *(float *)(in_R8 + (long)local_50 * 4);
  }
  return;
}

Assistant:

static inline void collect_hog_data(const MACROBLOCK *x, BLOCK_SIZE bsize,
                                    BLOCK_SIZE sb_size, int plane, float *hog) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  const int bh = block_size_high[bsize];
  const int bw = block_size_wide[bsize];
  const int rows =
      ((xd->mb_to_bottom_edge >= 0) ? bh : (xd->mb_to_bottom_edge >> 3) + bh) >>
      ss_y;
  const int cols =
      ((xd->mb_to_right_edge >= 0) ? bw : (xd->mb_to_right_edge >> 3) + bw) >>
      ss_x;

  // If gradient data is already generated at SB level, reuse the cached data.
  // Otherwise, compute the data.
  if (x->is_sb_gradient_cached[plane]) {
    generate_hog_using_gradient_cache(x, rows, cols, sb_size, plane, hog);
  } else {
    const uint8_t *src = x->plane[plane].src.buf;
    const int src_stride = x->plane[plane].src.stride;
    generate_hog(src, src_stride, rows, cols, hog, is_cur_buf_hbd(xd));
  }

  // Scale the hog so the luma and chroma are on the same scale
  for (int b = 0; b < BINS; ++b) {
    hog[b] *= (1 + ss_x) * (1 + ss_y);
  }
}